

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cc
# Opt level: O0

int open_socket(char *host)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  int *piVar6;
  undefined8 uVar7;
  vw_exception *this;
  ostream *poVar8;
  string *pmessage;
  ssize_t sVar9;
  char *in_RDI;
  char id;
  char __errmsg_2 [256];
  stringstream __msg_2;
  sockaddr_in far_end;
  char __errmsg_1 [256];
  stringstream __msg_1;
  int sd;
  char __errmsg [256];
  stringstream __msg;
  string hostname;
  hostent *he;
  unsigned_short port;
  char *colon;
  string *in_stack_fffffffffffff718;
  undefined8 in_stack_fffffffffffff720;
  char *in_stack_fffffffffffff728;
  vw_exception *in_stack_fffffffffffff730;
  undefined1 local_87a;
  undefined1 local_879;
  char local_858 [256];
  stringstream local_758 [16];
  ostream local_748;
  sockaddr local_5cc;
  undefined1 local_5b9;
  char local_598 [256];
  stringstream local_498 [16];
  ostream local_488;
  int local_310;
  undefined1 local_309;
  char local_2e8 [264];
  stringstream local_1e0 [16];
  ostream local_1d0;
  allocator local_41;
  string local_40 [32];
  hostent *local_20;
  uint16_t local_12;
  char *local_10;
  char *local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffff720 >> 0x20);
  local_8 = in_RDI;
  local_10 = index(in_RDI,0x3a);
  local_12 = 0x67ae;
  if (local_10 == (char *)0x0) {
    local_20 = gethostbyname(local_8);
  }
  else {
    iVar1 = atoi(local_10 + 1);
    pcVar4 = local_8;
    local_12 = (uint16_t)iVar1;
    uVar3 = (long)local_10 - (long)local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar4,uVar3,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_20 = gethostbyname(pcVar4);
    std::__cxx11::string::~string(local_40);
  }
  if (local_20 == (hostent *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1e0);
    poVar5 = std::operator<<(&local_1d0,"gethostbyname(");
    poVar5 = std::operator<<(poVar5,local_8);
    std::operator<<(poVar5,")");
    piVar6 = __errno_location();
    pcVar4 = strerror_r(*piVar6,local_2e8,0x100);
    if (pcVar4 == (char *)0x0) {
      poVar5 = std::operator<<(&local_1d0,"errno = ");
      std::operator<<(poVar5,local_2e8);
    }
    else {
      std::operator<<(&local_1d0,"errno = unknown");
    }
    local_309 = 1;
    uVar7 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffff730,in_stack_fffffffffffff728,iVar2,in_stack_fffffffffffff718);
    local_309 = 0;
    __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_310 = socket(2,1,0);
  if (local_310 == -1) {
    std::__cxx11::stringstream::stringstream(local_498);
    std::operator<<(&local_488,"socket");
    piVar6 = __errno_location();
    pcVar4 = strerror_r(*piVar6,local_598,0x100);
    if (pcVar4 == (char *)0x0) {
      poVar5 = std::operator<<(&local_488,"errno = ");
      std::operator<<(poVar5,local_598);
    }
    else {
      std::operator<<(&local_488,"errno = unknown");
    }
    local_5b9 = 1;
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception(this,in_stack_fffffffffffff728,iVar2,in_stack_fffffffffffff718);
    local_5b9 = 0;
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_5cc.sa_family = 2;
  local_5cc.sa_data._0_2_ = htons(local_12);
  local_5cc.sa_data._2_4_ = *(undefined4 *)*local_20->h_addr_list;
  memset(local_5cc.sa_data + 6,0,8);
  iVar2 = connect(local_310,&local_5cc,0x10);
  if (iVar2 == -1) {
    std::__cxx11::stringstream::stringstream(local_758);
    poVar5 = std::operator<<(&local_748,"connect(");
    poVar8 = std::operator<<(poVar5,local_8);
    pmessage = (string *)std::operator<<(poVar8,':');
    iVar2 = (int)((ulong)poVar8 >> 0x20);
    poVar8 = (ostream *)std::ostream::operator<<(pmessage,local_12);
    std::operator<<(poVar8,")");
    piVar6 = __errno_location();
    pcVar4 = strerror_r(*piVar6,local_858,0x100);
    if (pcVar4 == (char *)0x0) {
      poVar8 = std::operator<<(&local_748,"errno = ");
      std::operator<<(poVar8,local_858);
    }
    else {
      std::operator<<(&local_748,"errno = unknown");
    }
    local_879 = 1;
    uVar7 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception(in_stack_fffffffffffff730,(char *)poVar5,iVar2,pmessage);
    local_879 = 0;
    __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_87a = 0;
  sVar9 = write(local_310,&local_87a,1);
  if (sVar9 < 1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"write failed!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  return local_310;
}

Assistant:

int open_socket(const char* host)
{
#ifdef _WIN32
  const char* colon = strchr(host, ':');
#else
  const char* colon = index(host, ':');
#endif
  short unsigned int port = 26542;
  hostent* he;
  if (colon != nullptr)
  {
    port = atoi(colon + 1);
    string hostname(host, colon - host);
    he = gethostbyname(hostname.c_str());
  }
  else
    he = gethostbyname(host);

  if (he == nullptr)
    THROWERRNO("gethostbyname(" << host << ")");

  int sd = (int)socket(PF_INET, SOCK_STREAM, 0);
  if (sd == -1)
    THROWERRNO("socket");

  sockaddr_in far_end;
  far_end.sin_family = AF_INET;
  far_end.sin_port = htons(port);
  far_end.sin_addr = *(in_addr*)(he->h_addr);
  memset(&far_end.sin_zero, '\0', 8);
  if (connect(sd, (sockaddr*)&far_end, sizeof(far_end)) == -1)
    THROWERRNO("connect(" << host << ':' << port << ")");

  char id = '\0';
  if (
#ifdef _WIN32
      _write(sd, &id, sizeof(id)) < (int)sizeof(id)
#else
      write(sd, &id, sizeof(id)) < (int)sizeof(id)
#endif
  )
    cerr << "write failed!" << endl;
  return sd;
}